

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O3

void __thiscall FRemapTable::MakeIdentity(FRemapTable *this)

{
  long lVar1;
  
  if (0 < this->NumEntries) {
    lVar1 = 0;
    do {
      this->Remap[lVar1] = (BYTE)lVar1;
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->NumEntries);
    if (0 < this->NumEntries) {
      lVar1 = 0;
      do {
        this->Palette[lVar1].field_0 = GPalette.BaseColors[lVar1].field_0;
        lVar1 = lVar1 + 1;
      } while (lVar1 < this->NumEntries);
      if (1 < this->NumEntries) {
        lVar1 = 1;
        do {
          this->Palette[lVar1].field_0.field_0.a = 0xff;
          lVar1 = lVar1 + 1;
        } while (lVar1 < this->NumEntries);
      }
    }
  }
  return;
}

Assistant:

void FRemapTable::MakeIdentity()
{
	int i;

	for (i = 0; i < NumEntries; ++i)
	{
		Remap[i] = i;
	}
	for (i = 0; i < NumEntries; ++i)
	{
		Palette[i] = GPalette.BaseColors[i];
	}
	for (i = 1; i < NumEntries; ++i)
	{
		Palette[i].a = 255;
	}
}